

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O0

value_type * __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
::update(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
         *this,char_range key)

{
  int iVar1;
  bool bVar2;
  undefined8 uVar3;
  uint64_t uVar4;
  char_range *key_00;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
  *this_00;
  type_conflict *node_id_00;
  reference pvVar5;
  value_type_conflict7 *pvVar6;
  uint8_t *in_RDX;
  uint8_t *in_RSI;
  byte *in_RDI;
  pair<const_int_*,_unsigned_long> pVar7;
  int *vptr;
  type_conflict *match;
  type *vptr_1;
  uint64_t node_id;
  undefined7 in_stack_fffffffffffffd58;
  uint8_t in_stack_fffffffffffffd5f;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
  *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd78;
  value_type_conflict3 in_stack_fffffffffffffd7f;
  uint64_t *in_stack_fffffffffffffd80;
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *in_stack_fffffffffffffd88;
  value_type_conflict7 *local_260;
  pair<const_int_*,_unsigned_long> in_stack_fffffffffffffdd8;
  char_range *key_01;
  char_range *in_stack_fffffffffffffde8;
  compact_bonsai_nlm<int,_64UL> *in_stack_fffffffffffffdf0;
  compact_bonsai_nlm<int,_64UL> *in_stack_fffffffffffffdf8;
  uint64_t in_stack_fffffffffffffe60;
  uint32_t in_stack_fffffffffffffe6c;
  map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
  *in_stack_fffffffffffffe70;
  char_range local_18;
  value_type_conflict7 *local_8;
  
  local_18.begin = in_RSI;
  local_18.end = in_RDX;
  bVar2 = char_range::empty(&local_18);
  if (bVar2) {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffd60,
               (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  if (local_18.end[-1] != '\0') {
    uVar3 = __cxa_allocate_exception(0x10);
    exception::exception
              ((exception *)in_stack_fffffffffffffd60,
               (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
    __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
  }
  uVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::size
                    ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)(in_RDI + 0x10));
  if (uVar4 == 0) {
    if ((*in_RDI & 1) == 0) {
      map(in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,in_stack_fffffffffffffe60);
      operator=(in_stack_fffffffffffffd60,
                (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
                 *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      ~map(in_stack_fffffffffffffd60);
    }
    *(long *)(in_RDI + 0x1b8) = *(long *)(in_RDI + 0x1b8) + 1;
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_root
              ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)(in_RDI + 0x10));
    plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::get_root
              ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)(in_RDI + 0x10));
    local_8 = compact_bonsai_nlm<int,_64UL>::insert
                        (in_stack_fffffffffffffdf8,(uint64_t)in_stack_fffffffffffffdf0,
                         in_stack_fffffffffffffde8);
  }
  else {
    key_00 = (char_range *)
             plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::get_root
                       ((plain_bonsai_trie<90U,_poplar::hash::vigna_hasher> *)(in_RDI + 0x10));
    while( true ) {
      key_01 = (char_range *)in_stack_fffffffffffffdd8.second;
      bVar2 = char_range::empty(&local_18);
      if (((bVar2 ^ 0xffU) & 1) == 0) break;
      in_stack_fffffffffffffdd8 =
           compact_bonsai_nlm<int,_64UL>::compare(in_stack_fffffffffffffdf0,(uint64_t)key_00,key_01)
      ;
      this_00 = (map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::compact_bonsai_nlm<int,_64UL>_>
                 *)std::get<0ul,int_const*,unsigned_long>
                             ((pair<const_int_*,_unsigned_long> *)0x20cf1a);
      node_id_00 = std::get<1ul,int_const*,unsigned_long>
                             ((pair<const_int_*,_unsigned_long> *)0x20cf2c);
      if (*(type *)this_00 != (type)0x0) {
        return *(type *)this_00;
      }
      local_18.begin = local_18.begin + *node_id_00;
      while (*(ulong *)(in_RDI + 8) <= *node_id_00) {
        bVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                          (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                           CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
        if (bVar2) {
          expand_if_needed_(this_00,node_id_00);
        }
        *node_id_00 = *node_id_00 - *(long *)(in_RDI + 8);
      }
      pvVar5 = std::array<unsigned_char,_256UL>::operator[]
                         ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffd60,
                          CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
      if (*pvVar5 == 0xff) {
        iVar1 = *(int *)(in_RDI + 0x1b0);
        *(int *)(in_RDI + 0x1b0) = iVar1 + 1;
        in_stack_fffffffffffffd7f = (value_type_conflict3)iVar1;
        pvVar5 = std::array<unsigned_char,_256UL>::operator[]
                           ((array<unsigned_char,_256UL> *)in_stack_fffffffffffffd60,
                            CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
        *pvVar5 = in_stack_fffffffffffffd7f;
        if (*(int *)(in_RDI + 0x1b0) == 0xff) {
          uVar3 = __cxa_allocate_exception(0x10);
          exception::exception
                    ((exception *)in_stack_fffffffffffffd60,
                     (char *)CONCAT17(in_stack_fffffffffffffd5f,in_stack_fffffffffffffd58));
          __cxa_throw(uVar3,&exception::typeinfo,exception::~exception);
        }
      }
      make_symb_(in_stack_fffffffffffffd60,in_stack_fffffffffffffd5f,0x20d0e7);
      bVar2 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::add_child
                        (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80,
                         CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
      if (bVar2) {
        expand_if_needed_(this_00,node_id_00);
        local_18.begin = local_18.begin + 1;
        *(long *)(in_RDI + 0x1b8) = *(long *)(in_RDI + 0x1b8) + 1;
        pvVar6 = compact_bonsai_nlm<int,_64UL>::insert
                           (in_stack_fffffffffffffdf8,(uint64_t)in_stack_fffffffffffffdf0,key_00);
        return pvVar6;
      }
      local_18.begin = local_18.begin + 1;
    }
    pVar7 = compact_bonsai_nlm<int,_64UL>::compare
                      (in_stack_fffffffffffffdf0,(uint64_t)key_00,key_01);
    local_260 = pVar7.first;
    local_8 = local_260;
    if (local_260 == (value_type_conflict7 *)0x0) {
      local_8 = (value_type_conflict7 *)0x0;
    }
  }
  return local_8;
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }